

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_t drop_size_1;
  uint32_t actual_crc;
  uint32_t expected_crc;
  size_t drop_size;
  uint32_t length;
  uint type;
  uint32_t b;
  uint32_t a;
  char *header;
  Status status;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint64_t in_stack_ffffffffffffff50;
  long lVar7;
  Reader *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Reader *in_stack_ffffffffffffff70;
  int local_48;
  uint local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar4 = Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (6 < sVar4) {
      pcVar5 = Slice::data((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_24 = (uint)pcVar5[6];
      uVar1 = (uint)*(ushort *)(pcVar5 + 4);
      uVar6 = (ulong)(uVar1 + 7);
      sVar4 = Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (sVar4 < uVar6) {
        Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if ((*(byte *)(in_RDI + 6) & 1) == 0) {
          ReportCorruption(in_stack_ffffffffffffff70,
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                           in_stack_ffffffffffffff60);
          local_24 = 6;
        }
        else {
          local_24 = 5;
        }
        break;
      }
      if ((local_24 == 0) && (uVar1 == 0)) {
        Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_24 = 6;
        break;
      }
      if ((*(byte *)(in_RDI + 2) & 1) != 0) {
        DecodeFixed32(in_stack_ffffffffffffff40);
        uVar2 = crc32c::Unmask(in_stack_ffffffffffffff3c);
        uVar3 = crc32c::Value((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (size_t)in_stack_ffffffffffffff40);
        if (uVar3 != uVar2) {
          Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          ReportCorruption(in_stack_ffffffffffffff70,
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                           in_stack_ffffffffffffff60);
          local_24 = 6;
          break;
        }
      }
      Slice::remove_prefix
                ((Slice *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (size_t)in_stack_ffffffffffffff40);
      lVar7 = in_RDI[8];
      sVar4 = Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (((lVar7 - sVar4) + -7) - (ulong)uVar1 < (ulong)in_RDI[9]) {
        Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_24 = 6;
      }
      else {
        Slice::Slice((Slice *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40,
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        *in_RSI = local_20;
        in_RSI[1] = local_18;
      }
      break;
    }
    if ((*(byte *)(in_RDI + 6) & 1) != 0) {
      Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_24 = 5;
      break;
    }
    in_stack_ffffffffffffff70 = (Reader *)(in_RDI + 4);
    Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    (**(code **)(*(long *)*in_RDI + 0x10))
              (local_10,(long *)*in_RDI,0x8000,in_stack_ffffffffffffff70,in_RDI[3]);
    sVar4 = Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_RDI[8] = in_RDI[8] + sVar4;
    in_stack_ffffffffffffff6f =
         Status::ok((Status *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((bool)in_stack_ffffffffffffff6f) {
      in_stack_ffffffffffffff60 =
           (char *)Slice::size((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
      if (in_stack_ffffffffffffff60 < (char *)0x8000) {
        *(undefined1 *)(in_RDI + 6) = 1;
      }
      local_48 = 2;
    }
    else {
      Slice::clear((Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      ReportDrop(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (Status *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(undefined1 *)(in_RDI + 6) = 1;
      local_24 = 5;
      local_48 = 1;
    }
    Status::~Status((Status *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  } while (local_48 != 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice* result) {
  while (true) {
    if (buffer_.size() < kHeaderSize) {
      if (!eof_) {
        // Last read was a full read, so this is a trailer to skip
        buffer_.clear();
        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
        end_of_buffer_offset_ += buffer_.size();
        if (!status.ok()) {
          buffer_.clear();
          ReportDrop(kBlockSize, status);
          eof_ = true;
          return kEof;
        } else if (buffer_.size() < kBlockSize) {
          eof_ = true;
        }
        continue;
      } else {
        // Note that if buffer_ is non-empty, we have a truncated header at the
        // end of the file, which can be caused by the writer crashing in the
        // middle of writing the header. Instead of considering this an error,
        // just report EOF.
        buffer_.clear();
        return kEof;
      }
    }

    // Parse the header
    const char* header = buffer_.data();
    const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
    const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
    const unsigned int type = header[6];
    const uint32_t length = a | (b << 8);
    if (kHeaderSize + length > buffer_.size()) {
      size_t drop_size = buffer_.size();
      buffer_.clear();
      if (!eof_) {
        ReportCorruption(drop_size, "bad record length");
        return kBadRecord;
      }
      // If the end of the file has been reached without reading |length| bytes
      // of payload, assume the writer died in the middle of writing the record.
      // Don't report a corruption.
      return kEof;
    }

    if (type == kZeroType && length == 0) {
      // Skip zero length record without reporting any drops since
      // such records are produced by the mmap based writing code in
      // env_posix.cc that preallocates file regions.
      buffer_.clear();
      return kBadRecord;
    }

    // Check crc
    if (checksum_) {
      uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
      uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
      if (actual_crc != expected_crc) {
        // Drop the rest of the buffer since "length" itself may have
        // been corrupted and if we trust it, we could find some
        // fragment of a real log record that just happens to look
        // like a valid log record.
        size_t drop_size = buffer_.size();
        buffer_.clear();
        ReportCorruption(drop_size, "checksum mismatch");
        return kBadRecord;
      }
    }

    buffer_.remove_prefix(kHeaderSize + length);

    // Skip physical record that started before initial_offset_
    if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
        initial_offset_) {
      result->clear();
      return kBadRecord;
    }

    *result = Slice(header + kHeaderSize, length);
    return type;
  }
}